

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O2

bool __thiscall Clasp::Cli::ConfigIter::next(ConfigIter *this)

{
  char *__s;
  size_t sVar1;
  
  __s = args(this);
  this->base_ = __s;
  sVar1 = strlen(__s);
  this->base_ = __s + sVar1 + 1;
  return __s[sVar1 + 1] != '\0';
}

Assistant:

bool        ConfigIter::next()       {
	base_ = args();
	base_+= std::strlen(base_) + 1;
	return valid();
}